

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Token __thiscall slang::parsing::Preprocessor::handleDirectives(Preprocessor *this,Token token)

{
  BumpAllocator *pBVar1;
  Info *pIVar2;
  int iVar3;
  SyntaxKind SVar4;
  undefined4 extraout_var;
  long lVar5;
  SourceLocation SVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  char *__s1;
  EVP_PKEY_CTX *src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  EVP_PKEY_CTX *src_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  size_type __rlen;
  SourceRange range;
  Trivia TVar7;
  string_view sVar8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar9;
  Token TVar10;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  Token directive;
  SmallVector<slang::parsing::Token,_2UL> tokens;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  Token local_140;
  undefined1 local_130 [16];
  undefined1 local_120 [13];
  TriviaKind local_113;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  Trivia local_d8 [8];
  Token *local_58;
  Info *local_50;
  undefined8 local_48;
  Trivia local_40;
  
  local_f8._8_8_ = local_d8;
  local_e8 = 0;
  local_e0 = 8;
  local_58 = &this->lastConsumed;
  local_140 = token;
  do {
    TVar10 = local_140;
    if (local_140.kind < MacroQuote) {
      if (local_140.kind != Directive) {
        if (local_140.kind == Unknown) {
          sVar8 = Token::rawText(&local_140);
          __s1 = sVar8._M_str;
          if (sVar8._M_len == 2) {
            iVar3 = bcmp(__s1,"`\\",2);
            if (iVar3 == 0) {
LAB_002056ac:
              SVar6 = Token::location(&local_140);
              Diagnostics::add(this->diagnostics,(DiagCode)0x60002,
                               (SourceLocation)
                               ((long)SVar6 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                               (ulong)(SVar6._0_4_ & 0xfffffff)));
            }
          }
          else if (sVar8._M_len == 1) {
            iVar3 = bcmp(__s1,"\\",1);
            if (iVar3 == 0) goto LAB_002056ac;
            iVar3 = bcmp(__s1,"`",1);
            if (iVar3 == 0) {
              SVar6 = Token::location(&local_140);
              Diagnostics::add(this->diagnostics,(DiagCode)0xa0002,SVar6);
            }
          }
          sVar9 = Token::trivia(&local_140);
          SmallVectorBase<slang::parsing::Trivia>::
          append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),sVar9._M_ptr,
                     sVar9._M_ptr + sVar9._M_extent._M_extent_value._M_extent_value);
          pBVar1 = this->alloc;
          iVar3 = SmallVectorBase<slang::parsing::Trivia>::copy
                            ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                             (EVP_PKEY_CTX *)pBVar1,src_01);
          sVar9._M_ptr._4_4_ = extraout_var_01;
          sVar9._M_ptr._0_4_ = iVar3;
          sVar9._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
          TVar10 = Token::withTrivia(&local_140,pBVar1,sVar9);
          goto LAB_0020572d;
        }
LAB_00205660:
        sVar9 = Token::trivia(&local_140);
        SmallVectorBase<slang::parsing::Trivia>::
        append<__gnu_cxx::__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>_>
                  ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),sVar9._M_ptr,
                   sVar9._M_ptr + sVar9._M_extent._M_extent_value._M_extent_value);
        pBVar1 = this->alloc;
        iVar3 = SmallVectorBase<slang::parsing::Trivia>::copy
                          ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                           (EVP_PKEY_CTX *)pBVar1,src_00);
        trivia_00._M_ptr._4_4_ = extraout_var_00;
        trivia_00._M_ptr._0_4_ = iVar3;
        trivia_00._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
        TVar10 = Token::withTrivia(&local_140,pBVar1,trivia_00);
LAB_0020572d:
        if ((Trivia *)local_f8._8_8_ != local_d8) {
          operator_delete((void *)local_f8._8_8_);
        }
        return TVar10;
      }
      local_48._0_2_ = (this->lastConsumed).kind;
      local_48._2_1_ = (this->lastConsumed).field_0x2;
      local_48._3_1_ = (this->lastConsumed).numFlags;
      local_48._4_4_ = (this->lastConsumed).rawLen;
      local_50 = (this->lastConsumed).info;
      local_58->kind = local_140.kind;
      local_58->field_0x2 = local_140._2_1_;
      local_58->numFlags = (NumericTokenFlags)local_140.numFlags.raw;
      local_58->rawLen = local_140.rawLen;
      local_58->info = local_140.info;
      local_140 = TVar10;
      SVar4 = Token::directiveKind(&local_140);
      TVar10 = local_140;
      if ((int)SVar4 < 0xe7) {
        if ((int)SVar4 < 0xa7) {
          if (SVar4 - DefaultDecayTimeDirective < 0x13) {
            lVar5 = (long)&switchD_00204f12::switchdataD_002692cc +
                    (long)(int)(&switchD_00204f12::switchdataD_002692cc)
                               [SVar4 - DefaultDecayTimeDirective];
            switch(SVar4) {
            case DefaultDecayTimeDirective:
              TVar7 = handleDefaultDecayTimeDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            default:
switchD_00204f12_caseD_7f:
              if ((Trivia *)local_f8._8_8_ != &local_40) {
                operator_delete((void *)local_f8._8_8_);
              }
              _Unwind_Resume(lVar5);
            case DefaultNetTypeDirective:
              TVar7 = handleDefaultNetTypeDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            case DefaultTriregStrengthDirective:
              TVar7 = handleDefaultTriregStrengthDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            case DefineDirective:
              TVar7 = handleDefineDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              break;
            case DelayModeDistributedDirective:
            case DelayModePathDirective:
            case DelayModeUnitDirective:
            case DelayModeZeroDirective:
switchD_00204f12_caseD_8d:
              TVar7 = createSimpleDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
          }
          else if (SVar4 == BeginKeywordsDirective) {
            TVar7 = handleBeginKeywordsDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
          else {
            this->cellDefine = true;
            TVar7 = createSimpleDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
        }
        else if (SVar4 - ElseDirective < 0xf) {
          lVar5 = (long)&switchD_00204fd8::switchdataD_00269318 +
                  (long)(int)(&switchD_00204fd8::switchdataD_00269318)[SVar4 - ElseDirective];
          switch(SVar4) {
          case ElseDirective:
            TVar7 = handleElseDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          default:
            goto switchD_00204f12_caseD_7f;
          case EndCellDefineDirective:
            this->cellDefine = false;
            TVar7 = createSimpleDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          case EndIfDirective:
            TVar7 = handleEndIfDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          case EndKeywordsDirective:
            TVar7 = handleEndKeywordsDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            break;
          case EndProtectDirective:
          case EndProtectedDirective:
            goto switchD_00204f12_caseD_8d;
          }
        }
        else {
          TVar7 = handleElsIfDirective(this,local_140);
          local_130._0_8_ = TVar7.field_0._0_8_;
          local_130._8_6_ = TVar7._8_6_;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130);
        }
      }
      else {
        pIVar2 = local_140.info;
        if ((int)SVar4 < 0x181) {
          if ((int)SVar4 < 0x111) {
            if (SVar4 == IfDefDirective) {
              TVar7 = handleIfDefDirective(this,local_140,false);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
            else if (SVar4 == IfNDefDirective) {
              TVar7 = handleIfDefDirective(this,local_140,true);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
            else {
              TVar7 = handleIncludeDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
          }
          else if ((int)SVar4 < 0x148) {
            if (SVar4 == LineDirective) {
              TVar7 = handleLineDirective(this,local_140);
              local_130._0_8_ = TVar7.field_0._0_8_;
              local_130._8_6_ = TVar7._8_6_;
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
            }
            else {
              handleMacroUsage((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)local_130,
                               this,local_140);
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_130);
              if (local_113 != Unknown) {
                SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                          ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                           (Trivia *)local_120);
              }
            }
          }
          else if (SVar4 == NoUnconnectedDriveDirective) {
            local_f8._0_2_ = local_140.kind;
            local_f8[2] = local_140._2_1_;
            local_f8[3] = local_140.numFlags.raw;
            local_f8._4_4_ = local_140.rawLen;
            local_140 = TVar10;
            checkOutsideDesignElement(this,TVar10);
            this->unconnectedDrive = Unknown;
            directive.info = pIVar2;
            directive.kind = local_f8._0_2_;
            directive._2_1_ = local_f8[2];
            directive.numFlags.raw = local_f8[3];
            directive.rawLen = local_f8._4_4_;
            TVar7 = createSimpleDirective(this,directive);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
          else {
            handlePragmaDirective
                      ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)local_130,this,
                       local_140);
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            if (local_113 != Unknown) {
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_120);
            }
          }
        }
        else if ((int)SVar4 < 0x1cf) {
          if (SVar4 == ProtectDirective) goto switchD_00204f12_caseD_8d;
          if (SVar4 == ProtectedDirective) {
            handleProtectedDirective
                      ((pair<slang::parsing::Trivia,_slang::parsing::Trivia> *)local_130,this,
                       local_140);
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
            if (local_113 != Unknown) {
              SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia_const&>
                        ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),
                         (Trivia *)local_120);
            }
          }
          else {
            TVar7 = handleResetAllDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
        }
        else if ((int)SVar4 < 0x1f8) {
          if (SVar4 == TimeScaleDirective) {
            TVar7 = handleTimeScaleDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
          else {
            TVar7 = handleUnconnectedDriveDirective(this,local_140);
            local_130._0_8_ = TVar7.field_0._0_8_;
            local_130._8_6_ = TVar7._8_6_;
            SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                      ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130
                      );
          }
        }
        else if (SVar4 == UndefDirective) {
          TVar7 = handleUndefDirective(this,local_140);
          local_130._0_8_ = TVar7.field_0._0_8_;
          local_130._8_6_ = TVar7._8_6_;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130);
        }
        else {
          local_f8._0_2_ = local_140.kind;
          local_f8[2] = local_140._2_1_;
          local_f8[3] = local_140.numFlags.raw;
          local_f8._4_4_ = local_140.rawLen;
          local_140 = TVar10;
          undefineAll(this);
          TVar10.info = pIVar2;
          TVar10.kind = local_f8._0_2_;
          TVar10._2_1_ = local_f8[2];
          TVar10.numFlags.raw = local_f8[3];
          TVar10.rawLen = local_f8._4_4_;
          TVar7 = createSimpleDirective(this,TVar10);
          local_130._0_8_ = TVar7.field_0._0_8_;
          local_130._8_6_ = TVar7._8_6_;
          SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                    ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),(Trivia *)local_130);
        }
      }
      (this->lastConsumed).kind = (undefined2)local_48;
      (this->lastConsumed).field_0x2 = local_48._2_1_;
      (this->lastConsumed).numFlags = (NumericTokenFlags)local_48._3_1_;
      (this->lastConsumed).rawLen = local_48._4_4_;
      (this->lastConsumed).info = local_50;
    }
    else {
      if ((3 < local_140.kind - 0x15a) && (local_140.kind != LineContinuation)) goto LAB_00205660;
      local_130._8_8_ = 0;
      local_120._0_8_ = (char *)0x2;
      local_130._0_8_ = (pointer)(local_120 + 8);
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                ((SmallVectorBase<slang::parsing::Token> *)local_130,&local_140);
      iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                        ((SmallVectorBase<slang::parsing::Token> *)local_130,
                         (EVP_PKEY_CTX *)this->alloc,src);
      tokens_00._M_ptr._4_4_ = extraout_var;
      tokens_00._M_ptr._0_4_ = iVar3;
      tokens_00._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      Trivia::Trivia(&local_40,SkippedTokens,tokens_00);
      SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
                ((SmallVectorBase<slang::parsing::Trivia> *)(local_f8 + 8),&local_40);
      range = Token::range(&local_140);
      Diagnostics::add(this->diagnostics,(DiagCode)0x100004,range);
      if ((pointer)local_130._0_8_ != (pointer)(local_120 + 8)) {
        operator_delete((void *)local_130._0_8_);
      }
    }
    local_140 = nextRaw(this);
  } while( true );
}

Assistant:

Token Preprocessor::handleDirectives(Token token) {
    // burn through any preprocessor directives we find and convert them to trivia
    SmallVector<Trivia, 8> trivia;
    while (true) {
        switch (token.kind) {
            case TokenKind::MacroQuote:
            case TokenKind::MacroTripleQuote:
            case TokenKind::MacroEscapedQuote:
            case TokenKind::MacroPaste:
            case TokenKind::LineContinuation: {
                SmallVector<Token> tokens;
                tokens.push_back(token);
                trivia.push_back(Trivia(TriviaKind::SkippedTokens, tokens.copy(alloc)));
                addDiag(diag::MacroOpsOutsideDefinition, token.range());
                break;
            }
            case TokenKind::Unknown: {
                // This is an error in the lexer. See if we should issue any more
                // specific diagnostics here (that were deferred until we know we're
                // not inside a macro) and then return the token.
                auto raw = token.rawText();
                if (raw == "\\" || raw == "`\\")
                    addDiag(diag::EscapedWhitespace, token.location() + 1);
                else if (raw == "`")
                    addDiag(diag::MisplacedDirectiveChar, token.location());

                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
            }
            case TokenKind::Directive: {
                auto savedLast = std::exchange(lastConsumed, token);
                switch (token.directiveKind()) {
                    case SyntaxKind::IncludeDirective:
                        trivia.push_back(handleIncludeDirective(token));
                        break;
                    case SyntaxKind::ResetAllDirective:
                        trivia.push_back(handleResetAllDirective(token));
                        break;
                    case SyntaxKind::DefineDirective:
                        trivia.push_back(handleDefineDirective(token));
                        break;
                    case SyntaxKind::MacroUsage: {
                        auto [directive, extra] = handleMacroUsage(token);
                        trivia.push_back(directive);
                        if (extra)
                            trivia.push_back(extra);
                        break;
                    }
                    case SyntaxKind::IfDefDirective:
                        trivia.push_back(handleIfDefDirective(token, false));
                        break;
                    case SyntaxKind::IfNDefDirective:
                        trivia.push_back(handleIfDefDirective(token, true));
                        break;
                    case SyntaxKind::ElsIfDirective:
                        trivia.push_back(handleElsIfDirective(token));
                        break;
                    case SyntaxKind::ElseDirective:
                        trivia.push_back(handleElseDirective(token));
                        break;
                    case SyntaxKind::EndIfDirective:
                        trivia.push_back(handleEndIfDirective(token));
                        break;
                    case SyntaxKind::TimeScaleDirective:
                        trivia.push_back(handleTimeScaleDirective(token));
                        break;
                    case SyntaxKind::DefaultNetTypeDirective:
                        trivia.push_back(handleDefaultNetTypeDirective(token));
                        break;
                    case SyntaxKind::LineDirective:
                        trivia.push_back(handleLineDirective(token));
                        break;
                    case SyntaxKind::UndefDirective:
                        trivia.push_back(handleUndefDirective(token));
                        break;
                    case SyntaxKind::UndefineAllDirective:
                        trivia.push_back(handleUndefineAllDirective(token));
                        break;
                    case SyntaxKind::BeginKeywordsDirective:
                        trivia.push_back(handleBeginKeywordsDirective(token));
                        break;
                    case SyntaxKind::EndKeywordsDirective:
                        trivia.push_back(handleEndKeywordsDirective(token));
                        break;
                    case SyntaxKind::PragmaDirective: {
                        auto [directive, skipped] = handlePragmaDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::UnconnectedDriveDirective:
                        trivia.push_back(handleUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::NoUnconnectedDriveDirective:
                        trivia.push_back(handleNoUnconnectedDriveDirective(token));
                        break;
                    case SyntaxKind::CellDefineDirective:
                        trivia.push_back(handleCellDefineDirective(token));
                        break;
                    case SyntaxKind::EndCellDefineDirective:
                        trivia.push_back(handleEndCellDefineDirective(token));
                        break;
                    case SyntaxKind::DefaultDecayTimeDirective:
                        trivia.push_back(handleDefaultDecayTimeDirective(token));
                        break;
                    case SyntaxKind::DefaultTriregStrengthDirective:
                        trivia.push_back(handleDefaultTriregStrengthDirective(token));
                        break;
                    case SyntaxKind::ProtectedDirective: {
                        auto [directive, skipped] = handleProtectedDirective(token);
                        trivia.push_back(directive);
                        if (skipped)
                            trivia.push_back(skipped);
                        break;
                    }
                    case SyntaxKind::DelayModeDistributedDirective:
                    case SyntaxKind::DelayModePathDirective:
                    case SyntaxKind::DelayModeUnitDirective:
                    case SyntaxKind::DelayModeZeroDirective:
                    case SyntaxKind::ProtectDirective:
                    case SyntaxKind::EndProtectDirective:
                    case SyntaxKind::EndProtectedDirective:
                        // we don't do anything with these directives currently
                        trivia.push_back(createSimpleDirective(token));
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
                lastConsumed = savedLast;
                break;
            }
            default:
                trivia.append_range(token.trivia());
                return token.withTrivia(alloc, trivia.copy(alloc));
        }

        token = nextRaw();
    }
}